

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZXAlgorithms.h
# Opt level: O0

char ZXing::ToDigit<char>(int i)

{
  undefined8 uVar1;
  int in_EDI;
  string *msg;
  Type in_stack_ffffffffffffffc5;
  short in_stack_ffffffffffffffc6;
  char *in_stack_ffffffffffffffc8;
  Error *in_stack_ffffffffffffffd0;
  allocator<char> *in_stack_ffffffffffffffe0;
  undefined8 in_stack_ffffffffffffffe8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffff0;
  
  if ((-1 < in_EDI) && (in_EDI < 10)) {
    return (char)in_EDI + '0';
  }
  uVar1 = __cxa_allocate_exception(0x30);
  msg = (string *)&stack0xffffffffffffffd7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffff0,(char *)in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  Error::Error(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc6,
               in_stack_ffffffffffffffc5,msg);
  __cxa_throw(uVar1,&Error::typeinfo,Error::~Error);
}

Assistant:

T ToDigit(int i)
{
	if (i < 0 || i > 9)
		throw FormatError("Invalid digit value");
	return static_cast<T>('0' + i);
}